

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.c
# Opt level: O0

uint8_t * pci_map_resource(char *pci_addr)

{
  int iVar1;
  int *piVar2;
  undefined8 in_RDI;
  char buf_3 [512];
  int err_3;
  int64_t result_3;
  char buf_2 [512];
  int err_2;
  int64_t result_2;
  uint8_t *hw;
  char buf_1 [512];
  int err_1;
  int64_t result_1;
  stat stat;
  char buf [512];
  int err;
  int64_t result;
  int fd;
  char path [4096];
  undefined1 local_1918 [524];
  int local_170c;
  long local_1708;
  uint8_t *local_1700;
  undefined1 local_16f8 [516];
  int local_14f4;
  uint8_t *local_14f0;
  uint8_t *local_14e8;
  long local_14e0;
  undefined1 local_14d8 [524];
  int local_12cc;
  long local_12c8;
  stat local_12c0;
  long local_1230;
  undefined1 local_1228 [524];
  int local_101c;
  long local_1018;
  int local_100c;
  char local_1008 [2344];
  char *in_stack_fffffffffffff920;
  char *in_stack_fffffffffffffb20;
  
  snprintf(local_1008,0x1000,"/sys/bus/pci/devices/%s/resource0",in_RDI);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Mapping PCI resource at %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x2c,
          "pci_map_resource",local_1008);
  remove_driver(in_stack_fffffffffffff920);
  enable_dma(in_stack_fffffffffffffb20);
  local_100c = open(local_1008,2);
  local_1230 = (long)local_100c;
  local_1018 = local_1230;
  if (local_1230 == -1) {
    piVar2 = __errno_location();
    local_101c = *piVar2;
    __xpg_strerror_r(local_101c,local_1228,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x2f,
            "pci_map_resource","open pci resource",local_1228);
    exit(local_101c);
  }
  iVar1 = fstat(local_100c,&local_12c0);
  local_14e0 = (long)iVar1;
  local_12c8 = local_14e0;
  if (local_14e0 == -1) {
    piVar2 = __errno_location();
    local_12cc = *piVar2;
    __xpg_strerror_r(local_12cc,local_14d8,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x31,
            "pci_map_resource","stat pci resource",local_14d8);
    exit(local_12cc);
  }
  local_1700 = (uint8_t *)mmap((void *)0x0,local_12c0.st_size,3,1,local_100c,0);
  local_14f0 = local_1700;
  if (local_1700 == (uint8_t *)0xffffffffffffffff) {
    piVar2 = __errno_location();
    local_14f4 = *piVar2;
    __xpg_strerror_r(local_14f4,local_16f8,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x32,
            "pci_map_resource","mmap pci resource",local_16f8);
    exit(local_14f4);
  }
  local_14e8 = local_1700;
  iVar1 = close(local_100c);
  local_1708 = (long)iVar1;
  if (local_1708 == -1) {
    piVar2 = __errno_location();
    local_170c = *piVar2;
    __xpg_strerror_r(local_170c,local_1918,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/pci.c",0x33,
            "pci_map_resource","close pci resource",local_1918);
    exit(local_170c);
  }
  return local_14e8;
}

Assistant:

uint8_t* pci_map_resource(const char* pci_addr) {
	char path[PATH_MAX];
	snprintf(path, PATH_MAX, "/sys/bus/pci/devices/%s/resource0", pci_addr);
	debug("Mapping PCI resource at %s", path);
	remove_driver(pci_addr);
	enable_dma(pci_addr);
	int fd = check_err(open(path, O_RDWR), "open pci resource");
	struct stat stat;
	check_err(fstat(fd, &stat), "stat pci resource");
	uint8_t* hw = (uint8_t*) check_err(mmap(NULL, stat.st_size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0), "mmap pci resource");
	check_err(close(fd), "close pci resource");
	return hw;
}